

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-flow-kill.c
# Opt level: O0

_Bool borg_flow_kill_corridor(_Bool viewable)

{
  chunk_conflict *pcVar1;
  wchar_t wVar2;
  _Bool _Var3;
  int iVar4;
  int iVar5;
  borg_kill *pbVar7;
  loc_conflict lVar8;
  borg_grid *pbVar9;
  loc lVar10;
  wchar_t wVar6;
  loc lVar11;
  borg_grid *ag_3;
  borg_grid *ag_2;
  borg_grid *ag_1;
  borg_grid *ag;
  borg_kill *kill;
  wchar_t q_y;
  wchar_t q_x;
  wchar_t wall_west;
  wchar_t wall_east;
  wchar_t wall_south;
  wchar_t wall_north;
  wchar_t wx [25];
  int local_4f8 [2];
  wchar_t wy [25];
  int local_488 [2];
  wchar_t w_array [25];
  int local_418 [2];
  wchar_t ex [25];
  int local_3a8 [2];
  wchar_t ey [25];
  int local_338 [2];
  wchar_t e_array [25];
  int local_2c8 [2];
  wchar_t sx [25];
  int local_258 [2];
  wchar_t sy [25];
  int local_1e8 [2];
  wchar_t s_array [25];
  int local_178 [2];
  wchar_t nx [25];
  int local_108 [2];
  wchar_t ny [25];
  int local_98 [2];
  wchar_t n_array [25];
  int local_2c;
  _Bool b_w;
  _Bool b_e;
  _Bool b_s;
  _Bool b_n;
  wchar_t i;
  wchar_t b_distance;
  wchar_t b_x;
  wchar_t b_y;
  wchar_t m_y;
  wchar_t m_x;
  wchar_t o_x;
  wchar_t o_y;
  _Bool viewable_local;
  
  b_distance = L'\0';
  _b_w = L'c';
  n_array[0x18]._3_1_ = 0;
  n_array[0x18]._2_1_ = 0;
  n_array[0x18]._1_1_ = 0;
  n_array[0x18]._0_1_ = 0;
  memcpy(local_98,&DAT_00322410,100);
  memcpy(local_108,&DAT_00322480,100);
  memcpy(local_178,&DAT_003224f0,100);
  memcpy(local_1e8,&DAT_00322560,100);
  memcpy(local_258,&DAT_003225d0,100);
  memcpy(local_2c8,&DAT_00322640,100);
  memcpy(local_338,&DAT_003226b0,100);
  memcpy(local_3a8,&DAT_00322720,100);
  memcpy(local_418,&DAT_00322790,100);
  memcpy(local_488,&DAT_00322800,100);
  memcpy(local_4f8,&DAT_00322870,100);
  memcpy(&wall_south,&DAT_003228e0,100);
  borg_digging = false;
  if (borg_kills_cnt == 0) {
    o_x._3_1_ = false;
  }
  else if (borg_kills_summoner == -1) {
    o_x._3_1_ = false;
  }
  else if ((borg.trait[0x6d] == 0) && (borg.trait[0x6c] == 0)) {
    if (borg.time_this_panel < 0x1f5) {
      if (borg.trait[0x72] == 0) {
        if (borg.trait[0x1a] == 0) {
          o_x._3_1_ = false;
        }
        else if ((borg_morgoth_position & 1U) == 0) {
          if ((borg_as_position & 1U) == 0) {
            pbVar7 = borg_kills + borg_kills_summoner;
            _Var3 = flag_has_dbg(r_info[pbVar7->r_idx].flags,0xb,0x15,"r_info[kill->r_idx].flags",
                                 "RF_NEVER_MOVE");
            if (_Var3) {
              o_x._3_1_ = false;
            }
            else {
              _Var3 = flag_has_dbg(r_info[pbVar7->r_idx].flags,0xb,0x2e,"r_info[kill->r_idx].flags",
                                   "RF_PASS_WALL");
              if (_Var3) {
                o_x._3_1_ = false;
              }
              else {
                _Var3 = flag_has_dbg(r_info[pbVar7->r_idx].flags,0xb,0x2f,
                                     "r_info[kill->r_idx].flags","RF_KILL_WALL");
                if (_Var3) {
                  o_x._3_1_ = false;
                }
                else if ((pbVar7->awake & 1U) == 0) {
                  o_x._3_1_ = false;
                }
                else {
                  _Var3 = borg_spell_okay(TURN_STONE_TO_MUD);
                  if ((((_Var3) || (_Var3 = borg_spell_okay(SHATTER_STONE), _Var3)) ||
                      (_Var3 = borg_equips_ring(sv_ring_digging), _Var3)) ||
                     (_Var3 = borg_equips_item(act_stone_to_mud,true), _Var3)) {
                    _Var3 = borg_los((pbVar7->pos).y,(pbVar7->pos).x,borg.c.y,borg.c.x);
                    wVar6 = w_x;
                    if (!_Var3) {
                      iVar4 = borg_panel_wid();
                      wVar2 = w_y;
                      iVar4 = wVar6 / iVar4;
                      iVar5 = borg_panel_hgt();
                      iVar5 = wVar2 / iVar5;
                      if ((((borg_detect_wall[iVar5][iVar4] & 1U) == 1) &&
                          ((borg_detect_wall[iVar5][iVar4 + 1] & 1U) == 1)) &&
                         (((borg_detect_wall[iVar5 + 1][iVar4] & 1U) == 1 &&
                          ((borg_detect_wall[iVar5 + 1][iVar4 + 1] & 1U) == 1)))) {
                        borg_flow_clear();
                        borg_digging = true;
                        borg_flow_enqueue_grid((pbVar7->pos).y,(pbVar7->pos).x);
                        borg_flow_spread(L'\n',true,false,false,L'\xffffffff',false);
                        _Var3 = borg_flow_commit("Monster Path",L'\x01');
                        if (!_Var3) {
                          return false;
                        }
                      }
                      else {
                        borg_flow_clear();
                        borg_digging = true;
                        borg_flow_enqueue_grid((pbVar7->pos).y,(pbVar7->pos).x);
                        borg_flow_spread(L'\n',true,true,false,L'\xffffffff',false);
                        _Var3 = borg_flow_commit("Monster Path",L'\x01');
                        if (!_Var3) {
                          return false;
                        }
                      }
                    }
                    for (m_x = L'\xfffffffe'; m_x < L'\x01'; m_x = m_x + L'\x01') {
                      wall_east = L'\0';
                      for (local_2c = 0; pcVar1 = cave, local_2c < 0x19; local_2c = local_2c + 1) {
                        iVar4 = borg.c.y + m_x + ny[(long)local_2c + -2];
                        iVar5 = borg.c.x + nx[(long)local_2c + -2];
                        lVar8 = (loc_conflict)loc(iVar5,iVar4);
                        _Var3 = square_in_bounds_fully((chunk *)pcVar1,lVar8);
                        if (_Var3) {
                          pbVar9 = borg_grids[iVar4] + iVar5;
                          if ((n_array[(long)local_2c + -2] == L'\0') &&
                             (((pbVar9->feat == '\0' ||
                               ((0x10 < pbVar9->feat && (pbVar9->feat < 0x15)))) ||
                              (pbVar9->feat == '\x15')))) {
                            wall_east = wall_east + L'\x01';
                          }
                          if ((n_array[(long)local_2c + -2] == L'\x01') &&
                             ((pbVar9->feat < 7 ||
                              (((0x10 < pbVar9->feat && (pbVar9->feat < 0x15)) ||
                               (pbVar9->feat == '\x15')))))) {
                            wall_east = wall_east + L'\x01';
                          }
                        }
                      }
                      if (wall_east == L'\x19') {
                        lVar10 = loc(borg.c.x + nx[5],borg.c.y + m_x + ny[5]);
                        lVar11.y = borg.c.y;
                        lVar11.x = borg.c.x;
                        wVar6 = distance(lVar11,lVar10);
                        if (wVar6 < _b_w) {
                          b_distance = m_x;
                          n_array[0x18]._3_1_ = 1;
                          lVar11 = loc(borg.c.x + nx[5],borg.c.y + m_x + ny[5]);
                          lVar10.y = borg.c.y;
                          lVar10.x = borg.c.x;
                          _b_w = distance(lVar10,lVar11);
                        }
                      }
                    }
                    for (m_x = L'\xffffffff'; i = L'\0', m_x < L'\x02'; m_x = m_x + L'\x01') {
                      wall_west = L'\0';
                      for (local_2c = 0; pcVar1 = cave, local_2c < 0x19; local_2c = local_2c + 1) {
                        iVar4 = borg.c.y + m_x + sy[(long)local_2c + -2];
                        iVar5 = borg.c.x + sx[(long)local_2c + -2];
                        lVar8 = (loc_conflict)loc(iVar5,iVar4);
                        _Var3 = square_in_bounds_fully((chunk *)pcVar1,lVar8);
                        if (_Var3) {
                          pbVar9 = borg_grids[iVar4] + iVar5;
                          if ((s_array[(long)local_2c + -2] == L'\0') &&
                             (((pbVar9->feat == '\0' ||
                               ((0x10 < pbVar9->feat && (pbVar9->feat < 0x15)))) ||
                              (pbVar9->feat == '\x15')))) {
                            wall_west = wall_west + L'\x01';
                          }
                          if ((s_array[(long)local_2c + -2] == L'\x01') &&
                             (((pbVar9->feat < 7 || ((0x10 < pbVar9->feat && (pbVar9->feat < 0x15)))
                               ) || (pbVar9->feat == '\x15')))) {
                            wall_west = wall_west + L'\x01';
                          }
                        }
                      }
                      if ((wall_west == L'\x19') &&
                         (wVar6 = borg_distance(borg.c.y,borg.c.x,borg.c.y + m_x + sy[0xf],
                                                borg.c.x + sx[0xf]), wVar6 < _b_w)) {
                        b_distance = m_x;
                        n_array[0x18]._2_1_ = 1;
                        n_array[0x18]._3_1_ = 0;
                        _b_w = borg_distance(borg.c.y,borg.c.x,borg.c.y + m_x + sy[0xf],
                                             borg.c.x + sx[0xf]);
                      }
                    }
                    for (m_y = L'\xffffffff'; m_y < L'\x02'; m_y = m_y + L'\x01') {
                      q_x = L'\0';
                      for (local_2c = 0; pcVar1 = cave, local_2c < 0x19; local_2c = local_2c + 1) {
                        iVar4 = borg.c.y + ey[(long)local_2c + -2];
                        iVar5 = borg.c.x + m_y + ex[(long)local_2c + -2];
                        lVar8 = (loc_conflict)loc(iVar5,iVar4);
                        _Var3 = square_in_bounds_fully((chunk *)pcVar1,lVar8);
                        if (_Var3) {
                          pbVar9 = borg_grids[iVar4] + iVar5;
                          if ((e_array[(long)local_2c + -2] == L'\0') &&
                             ((pbVar9->feat == '\0' ||
                              (((0x10 < pbVar9->feat && (pbVar9->feat < 0x15)) ||
                               (pbVar9->feat == '\x15')))))) {
                            q_x = q_x + L'\x01';
                          }
                          if ((e_array[(long)local_2c + -2] == L'\x01') &&
                             (((pbVar9->feat < 7 || ((0x10 < pbVar9->feat && (pbVar9->feat < 0x15)))
                               ) || (pbVar9->feat == '\x15')))) {
                            q_x = q_x + L'\x01';
                          }
                        }
                      }
                      if ((q_x == L'\x19') &&
                         (wVar6 = borg_distance(borg.c.y,borg.c.x,borg.c.y + ey[0xb],
                                                borg.c.x + m_y + ex[0xb]), wVar6 < _b_w)) {
                        b_distance = L'\0';
                        i = m_y;
                        n_array[0x18]._1_1_ = 1;
                        n_array[0x18]._2_1_ = 0;
                        n_array[0x18]._3_1_ = 0;
                        _b_w = borg_distance(borg.c.y,borg.c.x,borg.c.y + ey[0xb],
                                             borg.c.x + m_y + ex[0xb]);
                      }
                    }
                    for (m_y = L'\xfffffffe'; m_y < L'\x01'; m_y = m_y + L'\x01') {
                      q_y = L'\0';
                      for (local_2c = 0; pcVar1 = cave, local_2c < 0x19; local_2c = local_2c + 1) {
                        iVar4 = borg.c.y + wy[(long)local_2c + -2];
                        iVar5 = borg.c.x + m_y + (&wall_south)[local_2c];
                        lVar8 = (loc_conflict)loc(iVar5,iVar4);
                        _Var3 = square_in_bounds_fully((chunk *)pcVar1,lVar8);
                        if (_Var3) {
                          pbVar9 = borg_grids[iVar4] + iVar5;
                          if ((w_array[(long)local_2c + -2] == L'\0') &&
                             ((pbVar9->feat == '\0' ||
                              (((0x10 < pbVar9->feat && (pbVar9->feat < 0x15)) ||
                               (pbVar9->feat == '\x15')))))) {
                            q_y = q_y + L'\x01';
                          }
                          if ((w_array[(long)local_2c + -2] == L'\x01') &&
                             (((pbVar9->feat < 7 || ((0x10 < pbVar9->feat && (pbVar9->feat < 0x15)))
                               ) || (pbVar9->feat == '\x15')))) {
                            q_y = q_y + L'\x01';
                          }
                        }
                      }
                      if ((q_y == L'\x19') &&
                         (wVar6 = borg_distance(borg.c.y,borg.c.x,borg.c.y + wy[9],
                                                borg.c.x + m_y + wx[9]), wVar6 < _b_w)) {
                        b_distance = L'\0';
                        i = m_y;
                        n_array[0x18]._0_1_ = 1;
                        n_array[0x18]._1_1_ = 0;
                        n_array[0x18]._2_1_ = 0;
                        n_array[0x18]._3_1_ = 0;
                        _b_w = borg_distance(borg.c.y,borg.c.x,borg.c.y + wy[9],
                                             borg.c.x + m_y + wx[9]);
                      }
                    }
                    if ((n_array[0x18]._3_1_ & 1) == 1) {
                      borg_flow_clear();
                      borg_digging = true;
                      borg_flow_enqueue_grid(borg.c.y + b_distance + ny[5],borg.c.x + i + nx[5]);
                      borg_flow_spread(L'\x05',true,false,true,L'\xffffffff',false);
                      _Var3 = borg_flow_commit("anti-summon corridor north type 1",L'\n');
                      if (_Var3) {
                        _Var3 = borg_flow_old(L'\n');
                        if (_Var3) {
                          o_x._3_1_ = true;
                        }
                        else {
                          o_x._3_1_ = false;
                        }
                      }
                      else {
                        o_x._3_1_ = false;
                      }
                    }
                    else if ((n_array[0x18]._2_1_ & 1) == 1) {
                      borg_flow_clear();
                      borg_digging = true;
                      borg_flow_enqueue_grid(borg.c.y + b_distance + sy[0xf],borg.c.x + i + sx[0xf])
                      ;
                      borg_flow_spread(L'\x06',true,false,true,L'\xffffffff',false);
                      _Var3 = borg_flow_commit("anti-summon corridor south type 1",L'\n');
                      if (_Var3) {
                        _Var3 = borg_flow_old(L'\n');
                        if (_Var3) {
                          o_x._3_1_ = true;
                        }
                        else {
                          o_x._3_1_ = false;
                        }
                      }
                      else {
                        o_x._3_1_ = false;
                      }
                    }
                    else if ((n_array[0x18]._1_1_ & 1) == 1) {
                      borg_flow_clear();
                      borg_digging = true;
                      borg_flow_enqueue_grid(borg.c.y + b_distance + ey[0xb],borg.c.x + i + ex[0xb])
                      ;
                      borg_digging = true;
                      borg_flow_spread(L'\x05',true,false,true,L'\xffffffff',false);
                      _Var3 = borg_flow_commit("anti-summon corridor east type 1",L'\n');
                      if (_Var3) {
                        _Var3 = borg_flow_old(L'\n');
                        if (_Var3) {
                          o_x._3_1_ = true;
                        }
                        else {
                          o_x._3_1_ = false;
                        }
                      }
                      else {
                        o_x._3_1_ = false;
                      }
                    }
                    else if (((byte)n_array[0x18] & 1) == 1) {
                      borg_flow_clear();
                      borg_digging = true;
                      borg_flow_enqueue_grid(borg.c.y + b_distance + wy[9],borg.c.x + i + wx[9]);
                      borg_flow_spread(L'\x05',true,false,true,L'\xffffffff',false);
                      _Var3 = borg_flow_commit("anti-summon corridor west type 1",L'\n');
                      if (_Var3) {
                        _Var3 = borg_flow_old(L'\n');
                        if (_Var3) {
                          o_x._3_1_ = true;
                        }
                        else {
                          o_x._3_1_ = false;
                        }
                      }
                      else {
                        o_x._3_1_ = false;
                      }
                    }
                    else {
                      o_x._3_1_ = false;
                    }
                  }
                  else {
                    o_x._3_1_ = false;
                  }
                }
              }
            }
          }
          else {
            o_x._3_1_ = false;
          }
        }
        else {
          o_x._3_1_ = false;
        }
      }
      else {
        o_x._3_1_ = false;
      }
    }
    else {
      o_x._3_1_ = false;
    }
  }
  else {
    o_x._3_1_ = false;
  }
  return o_x._3_1_;
}

Assistant:

bool borg_flow_kill_corridor(bool viewable)
{
    int o_y = 0;
    int o_x = 0;
    int m_x = 0;
    int m_y = 0;
    int b_y = 0, b_x = 0;
    int b_distance = 99;

    int  i;
    bool b_n        = false;
    bool b_s        = false;
    bool b_e        = false;
    bool b_w        = false;

    int n_array[25] = { 1, 0, 0, 0, 1, 
                        1, 0, 1, 0, 1, 
                        0, 1, 0, 1, 0, 
                        0, 0, 1, 0, 0, 
                        1, 1, 1, 1, 1 };
    int ny[25] = { -4, -4, -4, -4, -4, 
                   -3, -3, -3, -3, -3, 
                   -2, -2, -2, -2, -2,
                   -1, -1, -1, -1, -1, 
                    0,  0,  0,  0,  0 };
    int nx[25] = { -2, -1,  0,  1,  2, 
                   -2, -1,  0,  1,  2, 
                   -2, -1,  0,  1,  2, 
                   -2, -1,  0,  1,  2, 
                   -2, -1,  0,  1,  2 };

    int s_array[25] = { 1, 1, 1, 1, 1, 
                        0, 0, 1, 0, 0, 
                        0, 1, 0, 1, 0, 
                        1, 0, 1, 0, 1, 
                        1, 0, 0, 0, 1 };
    int sy[25] = { 0, 0, 0, 0, 0, 
                   1, 1, 1, 1, 1, 
                   2, 2, 2, 2, 2, 
                   3, 3, 3, 3, 3,
                   4, 4, 4, 4, 4 };
    int sx[25] = { -2, -1,  0,  1,  2, 
                   -2, -1,  0,  1,  2, 
                   -2, -1,  0,  1,  2, 
                   -2, -1,  0,  1,  2, 
                   -2, -1,  0,  1,  2 };

    int e_array[25] = { 1, 0, 0, 1, 1, 
                        1, 0, 1, 0, 0, 
                        1, 1, 0, 1, 0, 
                        1, 0, 1, 0, 0, 
                        1, 0, 0, 1, 1 };
    int ey[25] = { -2, -2, -2, -2, -2, 
                   -1, -1, -1, -1, -1, 
                    0,  0,  0,  0,  0, 
                    1,  1,  1,  1,  1, 
                    2,  2,  2,  2,  2 };
    int ex[25] = { 0, 1, 2, 3, 4, 
                   0, 1, 2, 3, 4, 
                   0, 1, 2, 3, 4, 
                   0, 1, 2, 3, 4,
                   0, 1, 2, 3, 4 };

    int w_array[25] = { 1, 1, 0, 0, 1, 
                        0, 0, 1, 0, 1, 
                        0, 1, 0, 1, 1, 
                        0, 0, 1, 0, 1, 
                        1, 1, 0, 0, 1 };
    int wy[25] = { -2, -2, -2, -2, -2, 
                   -1, -1, -1, -1, -1, 
                    0,  0,  0,  0,  0, 
                    1,  1,  1,  1,  1, 
                    2,  2,  2,  2,  2 };
    int wx[25] = { -4, -3, -2, -1, 0, 
                   -4, -3, -2, -1, 0, 
                   -4, -3, -2, -1, 0, 
                   -4, -3, -2, -1, 0, 
                   -4, -3, -2, -1, 0 };

    int wall_north = 0;
    int wall_south = 0;
    int wall_east  = 0;
    int wall_west  = 0;
    int q_x;
    int q_y;

    borg_kill *kill;

    borg_digging = false;

    /* Efficiency -- Nothing to kill */
    if (!borg_kills_cnt)
        return false;

    /* Only do this to summoners when they are close*/
    if (borg_kills_summoner == -1)
        return false;

    /* Hungry,starving */
    if (borg.trait[BI_ISHUNGRY] || borg.trait[BI_ISWEAK])
        return false;

    /* Sometimes we loop on this */
    if (borg.time_this_panel > 500)
        return false;

    /* Do not dig when confused */
    if (borg.trait[BI_ISCONFUSED])
        return false;

    /* Not when darkened */
    if (borg.trait[BI_LIGHT] == 0)
        return false;

    /* Not if sitting in a sea of runes */
    if (borg_morgoth_position)
        return false;
    if (borg_as_position)
        return false;

    /* get the summoning monster */
    kill = &borg_kills[borg_kills_summoner];

    /* Summoner must be mobile */
    if (rf_has(r_info[kill->r_idx].flags, RF_NEVER_MOVE))
        return false;
    /* Summoner must be able to pass through walls */
    if (rf_has(r_info[kill->r_idx].flags, RF_PASS_WALL))
        return false;
    if (rf_has(r_info[kill->r_idx].flags, RF_KILL_WALL))
        return false;

    /* Summoner has to be awake (so he will chase me */
    if (!kill->awake)
        return false;

    /* Must have Stone to Mud spell */
    if (!borg_spell_okay(TURN_STONE_TO_MUD) && !borg_spell_okay(SHATTER_STONE)
        && !borg_equips_ring(sv_ring_digging)
        && !borg_equips_item(act_stone_to_mud, true))
        return false;

    /* Summoner needs to be able to follow me.
     * So I either need to be able to
     * 1) have LOS on him or
     * 2) this panel needs to have had Magic Map or Wizard light cast on it.
     * If Mapped, then the flow codes needs to be used.
     */
    if (!borg_los(kill->pos.y, kill->pos.x, borg.c.y, borg.c.x)) {
        /* Extract panel */
        q_x = w_x / borg_panel_wid();
        q_y = w_y / borg_panel_hgt();

        if (borg_detect_wall[q_y + 0][q_x + 0] == true
            && borg_detect_wall[q_y + 0][q_x + 1] == true
            && borg_detect_wall[q_y + 1][q_x + 0] == true
            && borg_detect_wall[q_y + 1][q_x + 1] == true) {
            borg_flow_clear();
            borg_digging = true;
            borg_flow_enqueue_grid(kill->pos.y, kill->pos.x);
            borg_flow_spread(10, true, false, false, -1, false);
            if (!borg_flow_commit("Monster Path", GOAL_KILL))
                return false;
        } else {
            borg_flow_clear();
            borg_digging = true;
            borg_flow_enqueue_grid(kill->pos.y, kill->pos.x);
            borg_flow_spread(10, true, true, false, -1, false);
            if (!borg_flow_commit("Monster Path", GOAL_KILL))
                return false;
        }
    }

    /* NORTH -- Consider each area near the borg, looking for a good spot to
     * hide */
    for (o_y = -2; o_y < 1; o_y++) {
        /* Reset Wall count */
        wall_north = 0;

        /* No E-W offset when looking North-South */
        o_x = 0;

        for (i = 0; i < 25; i++) {
            borg_grid *ag;

            /* Check grids near borg */
            m_y = borg.c.y + o_y + ny[i];
            m_x = borg.c.x + o_x + nx[i];

            /* avoid screen edges */
            if (!square_in_bounds_fully(cave, loc(m_x, m_y))) {
                continue;
            }

            /* grid the grid */
            ag = &borg_grids[m_y][m_x];

            /* Certain grids must not be floor types */
            if (n_array[i] == 0
                && ((ag->feat == FEAT_NONE)
                    || (ag->feat >= FEAT_MAGMA && ag->feat <= FEAT_QUARTZ_K)
                    || ag->feat == FEAT_GRANITE)) {
                /* This is a good grid */
                wall_north++;
            }
            if (n_array[i] == 1
                && ((ag->feat <= FEAT_MORE)
                    || (ag->feat >= FEAT_MAGMA && ag->feat <= FEAT_QUARTZ_K)
                    || ag->feat == FEAT_GRANITE)) {
                /* A good wall would score 25. */
                wall_north++;
            }
        }

        /* If I found 25 grids, then that spot will work well */
        if (wall_north == 25) {
            if (distance(
                    borg.c, loc(borg.c.x + o_x + nx[7], borg.c.y + o_y + ny[7]))
                < b_distance) {
                b_y        = o_y;
                b_x        = o_x;
                b_n        = true;
                b_distance = distance(borg.c,
                    loc(borg.c.x + o_x + nx[7], borg.c.y + o_y + ny[7]));
            }
        }
    }

    /* SOUTH -- Consider each area near the borg, looking for a good spot to
     * hide */
    for (o_y = -1; o_y < 2; o_y++) {
        /* Reset Wall count */
        wall_south = 0;

        for (i = 0; i < 25; i++) {
            borg_grid *ag;

            /* No lateral offset on South check */
            o_x = 0;

            /* Check grids near borg */
            m_y = borg.c.y + o_y + sy[i];
            m_x = borg.c.x + o_x + sx[i];

            /* avoid screen edges */
            if (!square_in_bounds_fully(cave, loc(m_x, m_y)))
                continue;

            /* grid the grid */
            ag = &borg_grids[m_y][m_x];

            /* Certain grids must not be floor types */
            if (s_array[i] == 0
                && ((ag->feat == FEAT_NONE)
                    || (ag->feat >= FEAT_MAGMA && ag->feat <= FEAT_QUARTZ_K)
                    || ag->feat == FEAT_GRANITE)) {
                /* This is a good grid */
                wall_south++;
            }
            if (s_array[i] == 1
                && ((ag->feat <= FEAT_MORE)
                    || (ag->feat >= FEAT_MAGMA && ag->feat <= FEAT_QUARTZ_K)
                    || ag->feat == FEAT_GRANITE)) {
                /* A good wall would score 25. */
                wall_south++;
            }
        }

        /* If I found 25 grids, then that spot will work well */
        if (wall_south == 25) {
            if (borg_distance(borg.c.y, borg.c.x, borg.c.y + o_y + sy[17],
                    borg.c.x + o_x + sx[17])
                < b_distance) {
                b_y        = o_y;
                b_x        = o_x;
                b_s        = true;
                b_n        = false;
                b_distance = borg_distance(borg.c.y, borg.c.x,
                    borg.c.y + b_y + sy[17], borg.c.x + b_x + sx[17]);
            }
        }
    }

    /* EAST -- Consider each area near the borg, looking for a good spot to hide
     */
    for (o_x = -1; o_x < 2; o_x++) {
        /* Reset Wall count */
        wall_east = 0;

        /* No N-S offset check when looking E-W */
        o_y = 0;

        for (i = 0; i < 25; i++) {
            borg_grid *ag;

            /* Check grids near borg */
            m_y = borg.c.y + o_y + ey[i];
            m_x = borg.c.x + o_x + ex[i];

            /* avoid screen edges */
            if (!square_in_bounds_fully(cave, loc(m_x, m_y)))
                continue;

            /* grid the grid */
            ag = &borg_grids[m_y][m_x];

            /* Certain grids must not be floor types */
            if (e_array[i] == 0
                && ((ag->feat == FEAT_NONE)
                    || (ag->feat >= FEAT_MAGMA && ag->feat <= FEAT_QUARTZ_K)
                    || ag->feat == FEAT_GRANITE)) {
                /* This is a good grid */
                wall_east++;
            }
            if (e_array[i] == 1
                && ((ag->feat <= FEAT_MORE)
                    || (ag->feat >= FEAT_MAGMA && ag->feat <= FEAT_QUARTZ_K)
                    || ag->feat == FEAT_GRANITE)) {
                /* A good wall would score 25. */
                wall_east++;
            }
        }

        /* If I found 25 grids, then that spot will work well */
        if (wall_east == 25) {
            if (borg_distance(borg.c.y, borg.c.x, borg.c.y + o_y + ey[13],
                    borg.c.x + o_x + ex[13])
                < b_distance) {
                b_y        = o_y;
                b_x        = o_x;
                b_e        = true;
                b_s        = false;
                b_n        = false;
                b_distance = borg_distance(borg.c.y, borg.c.x,
                    borg.c.y + b_y + ey[13], borg.c.x + b_x + ex[13]);
            }
        }
    }

    /* WEST -- Consider each area near the borg, looking for a good spot to hide
     */
    for (o_x = -2; o_x < 1; o_x++) {
        /* Reset Wall count */
        wall_west = 0;

        /* No N-S offset check when looking E-W */
        o_y = 0;

        for (i = 0; i < 25; i++) {
            borg_grid *ag;

            /* Check grids near borg */
            m_y = borg.c.y + o_y + wy[i];
            m_x = borg.c.x + o_x + wx[i];

            /* avoid screen edges */
            if (!square_in_bounds_fully(cave, loc(m_x, m_y)))
                continue;

            /* grid the grid */
            ag = &borg_grids[m_y][m_x];

            /* Certain grids must not be floor types */
            if (w_array[i] == 0
                && ((ag->feat == FEAT_NONE)
                    || (ag->feat >= FEAT_MAGMA && ag->feat <= FEAT_QUARTZ_K)
                    || ag->feat == FEAT_GRANITE)) {
                /* This is a good grid */
                wall_west++;
            }
            if (w_array[i] == 1
                && ((ag->feat <= FEAT_MORE)
                    || (ag->feat >= FEAT_MAGMA && ag->feat <= FEAT_QUARTZ_K)
                    || ag->feat == FEAT_GRANITE)) {
                /* A good wall would score 25. */
                wall_west++;
            }
        }

        /* If I found 25 grids, then that spot will work well */
        if (wall_west == 25) {
            if (borg_distance(borg.c.y, borg.c.x, borg.c.y + o_y + wy[11],
                    borg.c.x + o_x + wx[11])
                < b_distance) {
                b_y        = o_y;
                b_x        = o_x;
                b_w        = true;
                b_e        = false;
                b_s        = false;
                b_n        = false;
                b_distance = borg_distance(borg.c.y, borg.c.x,
                    borg.c.y + o_y + wy[11], borg.c.x + o_x + wx[11]);
            }
        }
    }

    /* Attempt to enqueue the grids that should be floor grids and have the
     * borg move onto those grids
     */
    if (b_n == true) {
        /* Clear the flow codes */
        borg_flow_clear();

        /* Enqueue the grid where I will hide */
        borg_digging = true;
        borg_flow_enqueue_grid(borg.c.y + b_y + ny[7], borg.c.x + b_x + nx[7]);

        /* Spread the flow */
        borg_flow_spread(5, true, false, true, -1, false);

        /* Attempt to Commit the flow */
        if (!borg_flow_commit(
                "anti-summon corridor north type 1", GOAL_DIGGING))
            return false;

        /* Take one step */
        if (!borg_flow_old(GOAL_DIGGING))
            return false;

        return true;
    }
    if (b_s == true) {
        /* Clear the flow codes */
        borg_flow_clear();

        /* Enqueue the grid where I will hide */
        borg_digging = true;
        borg_flow_enqueue_grid(
            borg.c.y + b_y + sy[17], borg.c.x + b_x + sx[17]);

        /* Spread the flow */
        borg_flow_spread(6, true, false, true, -1, false);

        /* Attempt to Commit the flow */
        if (!borg_flow_commit(
                "anti-summon corridor south type 1", GOAL_DIGGING))
            return false;

        /* Take one step */
        if (!borg_flow_old(GOAL_DIGGING))
            return false;

        return true;
    }
    if (b_e == true) {
        /* Clear the flow codes */
        borg_flow_clear();

        /* Enqueue the grid where I will hide */
        borg_digging = true;
        borg_flow_enqueue_grid(
            borg.c.y + b_y + ey[13], borg.c.x + b_x + ex[13]);

        /* Spread the flow */
        borg_digging = true;
        borg_flow_spread(5, true, false, true, -1, false);

        /* Attempt to Commit the flow */
        if (!borg_flow_commit("anti-summon corridor east type 1", GOAL_DIGGING))
            return false;

        /* Take one step */
        if (!borg_flow_old(GOAL_DIGGING))
            return false;

        return true;
    }
    if (b_w == true) {
        /* Clear the flow codes */
        borg_flow_clear();

        /* Enqueue the grid where I will hide */
        borg_digging = true;
        borg_flow_enqueue_grid(
            borg.c.y + b_y + wy[11], borg.c.x + b_x + wx[11]);

        /* Spread the flow */
        borg_flow_spread(5, true, false, true, -1, false);

        /* Attempt to Commit the flow */
        if (!borg_flow_commit("anti-summon corridor west type 1", GOAL_DIGGING))
            return false;

        /* Take one step */
        if (!borg_flow_old(GOAL_DIGGING))
            return false;

        return true;
    }

    return false;
}